

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

string * __thiscall
t_js_generator::render_includes_abi_cxx11_(string *__return_storage_ptr__,t_js_generator *this)

{
  t_program *ptVar1;
  pointer pptVar2;
  t_program *program;
  pointer pptVar3;
  t_js_generator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  
  this_00 = (t_js_generator *)0x2cc953;
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"",(allocator *)&stack0xffffffffffffff78);
  if (this->gen_node_ == true) {
    ptVar1 = (this->super_t_oop_generator).super_t_generator.program_;
    pptVar2 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (pptVar3 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pptVar3 != pptVar2;
        pptVar3 = pptVar3 + 1) {
      program = *pptVar3;
      make_valid_nodeJs_identifier(&local_c8,this_00,&program->name_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb8,&this->js_const_type_,&local_c8);
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb8,"_ttypes = require(\'");
      get_import_path_abi_cxx11_((string *)&stack0xffffffffffffff98,this,program);
      std::operator+(&local_a8,&local_e8,(string *)&stack0xffffffffffffff98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff78,&local_a8,"\');\n");
      this_00 = (t_js_generator *)&stack0xffffffffffffff78;
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if ((ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::render_includes() {
  string result = "";

  if (gen_node_) {
    const vector<t_program*>& includes = program_->get_includes();
    for (auto include : includes) {
      result += js_const_type_ + make_valid_nodeJs_identifier(include->get_name()) + "_ttypes = require('" + get_import_path(include) + "');\n";
    }
    if (includes.size() > 0) {
      result += "\n";
    }
  }

  return result;
}